

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O2

Vec_Int_t * Gia_ManSaveValue(Gia_Man_t *p)

{
  Vec_Int_t *p_00;
  Gia_Obj_t *pGVar1;
  int v;
  
  p_00 = Vec_IntAlloc(p->nObjs);
  v = 0;
  while( true ) {
    if (p->nObjs <= v) {
      return p_00;
    }
    pGVar1 = Gia_ManObj(p,v);
    if (pGVar1 == (Gia_Obj_t *)0x0) break;
    Vec_IntPush(p_00,pGVar1->Value);
    v = v + 1;
  }
  return p_00;
}

Assistant:

Vec_Int_t * Gia_ManSaveValue( Gia_Man_t * p )
{
    Vec_Int_t * vValues;
    Gia_Obj_t * pObj;
    int i;
    vValues = Vec_IntAlloc( Gia_ManObjNum(p) );
    Gia_ManForEachObj( p, pObj, i )
        Vec_IntPush( vValues, pObj->Value );
    return vValues;
}